

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalSerialize
          (ModelProto_SentencePiece *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint32 uVar1;
  uint8 *puVar2;
  string *in_RDX;
  EpsCopyOutputStream *in_RSI;
  ModelProto_SentencePiece *in_RDI;
  uint32 cached_has_bits;
  ModelProto_SentencePiece *in_stack_fffffffffffffeb8;
  uint8 *in_stack_fffffffffffffec0;
  int32 value;
  EpsCopyOutputStream *in_stack_fffffffffffffec8;
  InternalMetadata *this_00;
  int size;
  uint8 *in_stack_fffffffffffffed8;
  EpsCopyOutputStream *this_01;
  string *s;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar3;
  ModelProto_SentencePiece *target_00;
  uint8 *in_stack_ffffffffffffff10;
  ModelProto_SentencePiece_Type in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  
  uVar3 = (in_RDI->_has_bits_).has_bits_[0];
  target_00 = in_RDI;
  if ((uVar3 & 1) != 0) {
    s = in_RDX;
    _internal_piece_abi_cxx11_(in_stack_fffffffffffffeb8);
    in_RSI = (EpsCopyOutputStream *)
             google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       ((EpsCopyOutputStream *)CONCAT44(uVar3,in_stack_fffffffffffffef0),
                        (uint32)((ulong)in_RDI >> 0x20),s,in_stack_fffffffffffffed8);
  }
  if ((uVar3 & 2) != 0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                       (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    _internal_score(in_RDI);
    uVar1 = google::protobuf::internal::WireFormatLite::MakeTag(2,WIRETYPE_FIXED32);
    puVar2 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar2);
    uVar1 = google::protobuf::internal::WireFormatLite::EncodeFloat(0.0);
    in_RSI = (EpsCopyOutputStream *)
             google::protobuf::io::CodedOutputStream::WriteLittleEndian32ToArray(uVar1,puVar2);
  }
  if ((uVar3 & 4) != 0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                       (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    value = (int32)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    in_stack_ffffffffffffff18 = _internal_type(in_RDI);
    in_stack_ffffffffffffff1c = 3;
    uVar1 = google::protobuf::internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    in_stack_ffffffffffffff10 =
         google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar2);
    in_RSI = (EpsCopyOutputStream *)
             google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                       (value,(uint8 *)in_stack_fffffffffffffeb8);
  }
  puVar2 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(int)in_stack_ffffffffffffff10
                      ,(uint8 *)target_00,in_RSI);
  if (((uint)(in_RDI->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    this_01 = (EpsCopyOutputStream *)&(in_RDI->super_MessageLite)._internal_metadata_;
    if (((uint)((InternalMetadata *)this_01)->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                ((InternalMetadata *)this_01);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    puVar2 = (uint8 *)std::__cxx11::string::data();
    this_00 = &(in_RDI->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
      size = (int)((ulong)this_00 >> 0x20);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
      size = (int)((ulong)this_00 >> 0x20);
    }
    std::__cxx11::string::size();
    puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw(this_01,in_RDX,size,puVar2);
  }
  return puVar2;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto_SentencePiece::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto.SentencePiece)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string piece = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_piece(), target);
  }

  // optional float score = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_score(), target);
  }

  // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_type(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto.SentencePiece)
  return target;
}